

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     resize_if_allowed<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,1>,double,double>
               (Matrix<double,__1,__1,_0,__1,__1> *dst,
               Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1>
               *src,assign_op<double,_double> *param_3)

{
  Index IVar1;
  Index IVar2;
  Index IVar3;
  Index in_RDX;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_RSI;
  bool bVar4;
  Index dstCols;
  Index dstRows;
  
  IVar1 = Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>
          ::rows((Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1>
                  *)0x15559d);
  IVar2 = Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>
          ::cols((Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1>
                  *)0x1555ac);
  IVar3 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x1555bb);
  if (IVar3 == IVar1) {
    IVar3 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                      ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x1555cc);
    if (IVar3 == IVar2) goto LAB_001555e7;
  }
  PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize(in_RSI,in_RDX,IVar1);
LAB_001555e7:
  IVar3 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x1555f1);
  bVar4 = false;
  if (IVar3 == IVar1) {
    IVar1 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                      ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x15560b);
    bVar4 = IVar1 == IVar2;
  }
  if (!bVar4) {
    __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/AssignEvaluator.h"
                  ,0x2d1,
                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1>, SrcXprType = Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>, 1>, T1 = double, T2 = double]"
                 );
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE
void resize_if_allowed(DstXprType &dst, const SrcXprType& src, const internal::assign_op<T1,T2> &/*func*/)
{
  Index dstRows = src.rows();
  Index dstCols = src.cols();
  if(((dst.rows()!=dstRows) || (dst.cols()!=dstCols)))
    dst.resize(dstRows, dstCols);
  eigen_assert(dst.rows() == dstRows && dst.cols() == dstCols);
}